

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.c
# Opt level: O0

void raviX_output_cfg(Proc *proc,FILE *fp)

{
  FILE *local_30;
  CfgArg args;
  Graph *g;
  FILE *fp_local;
  Proc *proc_local;
  
  args.proc = (Proc *)proc->cfg;
  if (args.proc != (Proc *)0x0) {
    fprintf((FILE *)fp,"digraph Proc%d {\n",(ulong)proc->id);
    local_30 = fp;
    args.fp = (FILE *)proc;
    raviX_for_each_node((Graph *)args.proc,output_node,&local_30);
    fprintf((FILE *)fp,"}\n");
  }
  return;
}

Assistant:

void raviX_output_cfg(Proc *proc, FILE *fp)
{
	Graph *g = proc->cfg;
	if (!g)
		return;
	fprintf(fp, "digraph Proc%d {\n", proc->id);
	struct CfgArg args = {fp, proc};
	raviX_for_each_node(g, output_node, &args);
	fprintf(fp, "}\n");
}